

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackDebGenerator.cxx
# Opt level: O2

int __thiscall cmCPackDebGenerator::PackageFiles(cmCPackDebGenerator *this)

{
  ComponentPackageMethod CVar1;
  int iVar2;
  allocator<char> local_29;
  string local_28;
  
  iVar2 = (*(this->super_cmCPackGenerator)._vptr_cmCPackGenerator[0x18])();
  if ((char)iVar2 == '\0') {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"",&local_29);
    iVar2 = PackageComponentsAllInOne(this,&local_28);
  }
  else {
    CVar1 = (this->super_cmCPackGenerator).componentPackageMethod;
    if (CVar1 != ONE_PACKAGE) {
      iVar2 = PackageComponents(this,CVar1 == ONE_PACKAGE_PER_COMPONENT);
      return iVar2;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_28,"ALL_COMPONENTS_IN_ONE",&local_29);
    iVar2 = PackageComponentsAllInOne(this,&local_28);
  }
  std::__cxx11::string::~string((string *)&local_28);
  return iVar2;
}

Assistant:

int cmCPackDebGenerator::PackageFiles()
{
  /* Are we in the component packaging case */
  if (this->WantsComponentInstallation()) {
    // CASE 1 : COMPONENT ALL-IN-ONE package
    // If ALL GROUPS or ALL COMPONENTS in ONE package has been requested
    // then the package file is unique and should be open here.
    if (this->componentPackageMethod == ONE_PACKAGE) {
      return this->PackageComponentsAllInOne("ALL_COMPONENTS_IN_ONE");
    }
    // CASE 2 : COMPONENT CLASSICAL package(s) (i.e. not all-in-one)
    // There will be 1 package for each component group
    // however one may require to ignore component group and
    // in this case you'll get 1 package for each component.
    return this->PackageComponents(this->componentPackageMethod ==
                                   ONE_PACKAGE_PER_COMPONENT);
  }
  // CASE 3 : NON COMPONENT package.
  return this->PackageComponentsAllInOne("");
}